

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O1

pair<double,_double> __thiscall
manager::Manager<uttt::IBoard>::Match
          (Manager<uttt::IBoard> *this,longlong bot_id1,longlong bot_id2,int count)

{
  __buckets_ptr pp_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  IBoard *pIVar4;
  double dVar5;
  undefined1 auVar6 [12];
  short sVar7;
  short sVar8;
  long *plVar9;
  _Hash_node_base *p_Var10;
  int iVar11;
  IBoard *this_00;
  long *plVar12;
  uint uVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined8 uVar20;
  undefined1 auVar19 [16];
  pair<double,_double> pVar21;
  IBot<uttt::IBoard> *bs [2];
  IMove move;
  undefined1 local_78 [16];
  long *local_68 [3];
  _Hash_node_base *local_50;
  _Hash_node_base *local_48;
  IMove local_40;
  Manager<uttt::IBoard> *local_38;
  
  pp_Var1 = (this->bots)._M_h._M_buckets;
  uVar2 = (this->bots)._M_h._M_bucket_count;
  p_Var15 = pp_Var1[(ulong)bot_id1 % uVar2];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var16 = p_Var15->_M_nxt, p_Var14 = p_Var15, p_Var16[1]._M_nxt != (_Hash_node_base *)bot_id1)
     ) {
    while (p_Var3 = p_Var16->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != (ulong)bot_id1 % uVar2) ||
         (p_Var14 = p_Var16, p_Var16 = p_Var3, p_Var3[1]._M_nxt == (_Hash_node_base *)bot_id1))
      goto LAB_0014a565;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_0014a565:
  if (p_Var14 == (__node_base_ptr)0x0) {
    local_48 = (_Hash_node_base *)0x0;
  }
  else {
    local_48 = p_Var14->_M_nxt;
  }
  p_Var15 = pp_Var1[(ulong)bot_id2 % uVar2];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var15->_M_nxt, p_Var14 = p_Var15,
     p_Var15->_M_nxt[1]._M_nxt != (_Hash_node_base *)bot_id2)) {
    while (p_Var15 = p_Var3, p_Var3 = p_Var15->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != (ulong)bot_id2 % uVar2) ||
         (p_Var14 = p_Var15, p_Var3[1]._M_nxt == (_Hash_node_base *)bot_id2)) goto LAB_0014a5cf;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_0014a5cf:
  if (p_Var14 == (__node_base_ptr)0x0) {
    local_50 = (_Hash_node_base *)0x0;
  }
  else {
    local_50 = p_Var14->_M_nxt;
  }
  local_38 = this;
  if (count < 1) {
    local_78 = ZEXT816(0);
  }
  else {
    uVar13 = 0;
    local_78 = ZEXT816(0);
    do {
      this_00 = (IBoard *)operator_new(0x18);
      pIVar4 = local_38->game;
      sVar7 = (pIVar4->micro)._M_elems[0];
      sVar8 = (pIVar4->micro)._M_elems[1];
      uVar20 = *(undefined8 *)((pIVar4->micro)._M_elems + 2);
      this_00->macro = pIVar4->macro;
      (this_00->micro)._M_elems[0] = sVar7;
      (this_00->micro)._M_elems[1] = sVar8;
      *(undefined8 *)((this_00->micro)._M_elems + 2) = uVar20;
      *(undefined8 *)((this_00->micro)._M_elems + 6) = *(undefined8 *)((pIVar4->micro)._M_elems + 6)
      ;
      local_68[0] = (long *)0x0;
      local_68[1] = (long *)0x0;
      plVar12 = (long *)(*(code *)(local_48[2]._M_nxt[1]._M_nxt)->_M_nxt[2]._M_nxt)();
      uVar17 = uVar13 & 1;
      local_68[uVar17] = plVar12;
      plVar12 = (long *)(*(code *)(local_50[2]._M_nxt[1]._M_nxt)->_M_nxt[2]._M_nxt)();
      local_68[uVar17 ^ 1] = plVar12;
      iVar11 = uttt::IBoard::GetStatus(this_00);
      plVar9 = local_68[1];
      plVar12 = local_68[0];
      while (iVar11 == -1) {
        local_40 = (**(code **)(*plVar12 + 0x18))(plVar12);
        uttt::IBoard::ApplyMove(this_00,&local_40);
        (**(code **)(*plVar9 + 0x20))(plVar9,&local_40);
        iVar11 = uttt::IBoard::GetStatus(this_00);
        if (iVar11 != -1) break;
        local_40 = (**(code **)(*plVar9 + 0x18))(plVar9);
        uttt::IBoard::ApplyMove(this_00,&local_40);
        (**(code **)(*plVar12 + 0x20))(plVar12,&local_40);
        iVar11 = uttt::IBoard::GetStatus(this_00);
      }
      if (iVar11 == 1) {
        if (uVar17 != 0) goto LAB_0014a730;
LAB_0014a715:
        dVar5 = (double)local_78._0_8_ + 1.0;
LAB_0014a723:
        uVar2 = (ulong)local_78._8_8_ >> 0x20;
        local_78._8_4_ = (int)local_78._8_8_;
        local_78._0_8_ = dVar5;
        local_78._12_4_ = (int)uVar2;
      }
      else {
        if (iVar11 == 0) {
          dVar5 = (double)local_78._0_8_ + 0.5;
          local_78._8_8_ = (double)local_78._8_8_ + 0.5;
          goto LAB_0014a723;
        }
        if (uVar17 != 0) goto LAB_0014a715;
LAB_0014a730:
        local_78._8_8_ = (double)local_78._8_8_ + 1.0;
      }
      if (local_68[0] != (long *)0x0) {
        (**(code **)(*local_68[0] + 8))();
      }
      if (local_68[1] != (long *)0x0) {
        (**(code **)(*local_68[1] + 8))();
      }
      operator_delete(this_00);
      uVar13 = uVar13 + 1;
    } while (uVar13 != count);
  }
  p_Var10 = local_48;
  p_Var3 = local_50;
  dVar5 = (double)count;
  auVar18._8_4_ = SUB84(dVar5,0);
  auVar18._0_8_ = dVar5;
  auVar18._12_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar18 = divpd(local_78,auVar18);
  uVar20 = 0;
  pVar21 = MM::operator()((MM *)local_68,(double)local_48[2]._M_nxt[2]._M_nxt,
                          (double)local_50[2]._M_nxt[2]._M_nxt,auVar18._0_8_);
  p_Var10[2]._M_nxt[2]._M_nxt = (_Hash_node_base *)pVar21.first;
  p_Var3[2]._M_nxt[2]._M_nxt = (_Hash_node_base *)pVar21.second;
  auVar6._4_8_ = uVar20;
  auVar6._0_4_ = auVar18._4_4_;
  auVar19._0_8_ = auVar6._0_8_ << 0x20;
  auVar19._8_4_ = auVar18._8_4_;
  auVar19._12_4_ = auVar18._12_4_;
  pVar21.second = auVar19._8_8_;
  pVar21.first = auVar18._0_8_;
  return pVar21;
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}